

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::StartEmitBlock(ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock)

{
  Scope *innerScope;
  FuncInfo *funcInfo;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = BlockHasOwnScope(pnodeBlock,this);
  if (bVar2) {
    if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xff6,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
      if (!bVar2) goto LAB_00808c63;
      *puVar3 = 0;
    }
    PushBlock(this,pnodeBlock);
    innerScope = pnodeBlock->scope;
    if ((((pnodeBlock->field_0x5c & 0xc) != 0) || ((this->flags & 0x404) != 0)) &&
       ((innerScope->field_0x44 & 2) == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xffd,"(scope->GetIsObject())","scope->GetIsObject()");
      if (!bVar2) {
LAB_00808c63:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if ((innerScope->field_0x44 & 0x10) != 0) {
      funcInfo = innerScope->func;
      EnsureFncScopeSlots(this,pnodeBlock->pnodeScopes,funcInfo);
      EnsureLetConstScopeSlots(this,pnodeBlock,funcInfo);
      PushScope(this,innerScope);
      return;
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::StartEmitBlock(ParseNodeBlock *pnodeBlock)
{
    if (!BlockHasOwnScope(pnodeBlock, this))
    {
        return;
    }

    Assert(pnodeBlock->nop == knopBlock);

    PushBlock(pnodeBlock);

    Scope *scope = pnodeBlock->scope;
    if (pnodeBlock->GetCallsEval() || pnodeBlock->GetChildCallsEval() || (this->flags & (fscrEval | fscrImplicitThis)))
    {
        Assert(scope->GetIsObject());
    }

    // TODO: Consider nested deferred parsing.
    if (scope->GetMustInstantiate())
    {
        FuncInfo *funcInfo = scope->GetFunc();
        this->EnsureFncScopeSlots(pnodeBlock->pnodeScopes, funcInfo);
        this->EnsureLetConstScopeSlots(pnodeBlock, funcInfo);
        PushScope(scope);
    }
}